

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SkelAnimation>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               SkelAnimation *skelanim,string *warn,string *err,PrimReconstructOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Base_ptr __k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  undefined1 auVar4 [8];
  size_type sVar5;
  TimeSamples *pTVar6;
  size_type sVar7;
  undefined1 uVar8;
  int iVar9;
  ostream *poVar10;
  long *plVar11;
  undefined8 *puVar12;
  const_iterator cVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  size_type sVar16;
  byte bVar17;
  char cVar18;
  ulong uVar19;
  string *psVar20;
  Property *pPVar21;
  undefined1 auVar22 [8];
  pointer pSVar23;
  long lVar24;
  bool bVar25;
  ParseResult ret;
  ParseResult ret_2;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> dst;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  *in_stack_fffffffffffffb88;
  undefined1 local_468 [8];
  _Alloc_hider local_460;
  undefined1 auStack_458 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_450;
  size_type local_430;
  undefined8 uStack_428;
  char **local_420;
  undefined1 *local_418;
  char *local_410;
  undefined1 local_408;
  undefined7 uStack_407;
  undefined1 local_3f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 uStack_3c8;
  undefined7 uStack_3c7;
  undefined1 uStack_3c0;
  Attribute *local_3b0;
  byte local_3a8;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  local_3a0;
  string local_388;
  string local_368;
  SkelAnimation *local_348;
  AttrMetas *local_340;
  TimeSamples *local_338;
  AttrMetas *local_330;
  optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> local_328;
  ios_base *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
  *local_2c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2b8;
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
  *local_2b0;
  string *local_2a8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_2a0;
  string *local_298;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_290;
  string *local_288;
  string *local_280;
  _Base_ptr local_278;
  _Base_ptr local_270;
  _anonymous_namespace_ local_268 [8];
  _Rb_tree_node_base local_260;
  undefined8 local_240;
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a8;
  undefined2 local_198;
  _Alloc_hider local_190;
  pointer pSStack_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [3];
  ios_base local_148 [16];
  ios_base local_138 [264];
  
  local_260._M_left = &local_260;
  local_260._M_color = _S_red;
  local_260._M_parent = (_Base_ptr)0x0;
  local_240 = 0;
  p_Var15 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_278 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar25 = true;
  local_260._M_right = local_260._M_left;
  if (p_Var15 != local_278) {
    local_280 = (string *)&skelanim->joints;
    local_288 = (string *)&skelanim->translations;
    local_330 = &(skelanim->rotations)._metas;
    local_290 = &(skelanim->rotations)._paths;
    local_308 = local_138;
    local_2b0 = (optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                 *)&(skelanim->rotations)._attrib;
    local_340 = &(skelanim->scales)._metas;
    local_2a0 = &(skelanim->scales)._paths;
    local_2c0 = (optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                 *)&(skelanim->scales)._attrib;
    local_298 = (string *)&skelanim->blendShapes;
    local_2a8 = (string *)&skelanim->blendShapeWeights;
    local_2b8 = &skelanim->props;
    local_348 = skelanim;
    do {
      local_1d8[0] = local_1c8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d8,*(long *)(p_Var15 + 1),
                 (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
      local_270 = p_Var15;
      local_1b8 = (undefined1  [8])(local_1b0 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"joints","");
      pPVar21 = (Property *)local_1b8;
      local_3b0 = (Attribute *)(p_Var15 + 2);
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                ((ParseResult *)local_468,local_268,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1d8,(string *)(p_Var15 + 2),(Property *)local_1b8,local_280,
                 (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                 in_stack_fffffffffffffb88);
      if (local_1b8 != (undefined1  [8])(local_1b0 + 8)) {
        operator_delete((void *)local_1b8,(ulong)(aStack_1a8._M_allocated_capacity + 1));
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      p_Var15 = local_270;
      iVar9 = 0;
      if (((ulong)local_468 & 0xfffffffd) == 0) {
        iVar9 = 3;
LAB_001f929a:
        bVar25 = false;
      }
      else {
        bVar25 = true;
        if (local_468._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbaf);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          local_420 = &local_410;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_420,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[7],std::__cxx11::string>
                    ((string *)local_3f8,(fmt *)&local_420,(string *)"joints",
                     (char (*) [7])&local_460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar21);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,(char *)local_3f8._0_8_,
                               CONCAT62(local_3f8._10_6_,local_3f8._8_2_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_3f8 + 0x10);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
              != pbVar2) {
            operator_delete((void *)local_3f8._0_8_,CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1)
            ;
          }
          if (local_420 != &local_410) {
            operator_delete(local_420,(ulong)(local_410 + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar11 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_420,(ulong)(err->_M_dataplus)._M_p);
            pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar11 + 2);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11 ==
                pbVar1) {
              pcVar3 = (pbVar1->_M_dataplus)._M_p;
              local_3f8._16_2_ = SUB82(pcVar3,0);
              local_3f8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
              local_3f8._24_2_ = (undefined2)plVar11[3];
              local_3f8._26_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
              local_3f8._0_8_ = pbVar2;
            }
            else {
              pcVar3 = (pbVar1->_M_dataplus)._M_p;
              local_3f8._16_2_ = SUB82(pcVar3,0);
              local_3f8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
              local_3f8._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11;
            }
            local_3f8._8_2_ = (undefined2)plVar11[1];
            local_3f8._10_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
            *plVar11 = (long)pbVar1;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_3f8);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
                != pbVar2) {
              operator_delete((void *)local_3f8._0_8_,
                              CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
            }
            if (local_420 != &local_410) {
              operator_delete(local_420,(ulong)(local_410 + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          ::std::ios_base::~ios_base(local_148);
          iVar9 = 1;
          goto LAB_001f929a;
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460._M_p !=
          &bStack_450) {
        operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
      }
      if (bVar25) {
        local_1f8[0] = local_1e8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        local_1b8 = (undefined1  [8])(local_1b0 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"translations","");
        pPVar21 = (Property *)local_1b8;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                  ((ParseResult *)local_468,local_268,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1f8,&local_3b0->_name,(Property *)local_1b8,local_288,
                   in_stack_fffffffffffffb88);
        if (local_1b8 != (undefined1  [8])(local_1b0 + 8)) {
          operator_delete((void *)local_1b8,(ulong)(aStack_1a8._M_allocated_capacity + 1));
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
        iVar9 = 0;
        if (((ulong)local_468 & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_001f95bf:
          bVar25 = false;
        }
        else {
          bVar25 = true;
          if (local_468._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbb0);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            local_420 = &local_410;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_420,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[13],std::__cxx11::string>
                      ((string *)local_3f8,(fmt *)&local_420,(string *)"translations",
                       (char (*) [13])&local_460,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar21)
            ;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,(char *)local_3f8._0_8_,
                                 CONCAT62(local_3f8._10_6_,local_3f8._8_2_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_3f8 + 0x10);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
                != pbVar2) {
              operator_delete((void *)local_3f8._0_8_,
                              CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
            }
            if (local_420 != &local_410) {
              operator_delete(local_420,(ulong)(local_410 + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar11 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_420,(ulong)(err->_M_dataplus)._M_p);
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar11 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11 ==
                  pbVar1) {
                pcVar3 = (pbVar1->_M_dataplus)._M_p;
                local_3f8._16_2_ = SUB82(pcVar3,0);
                local_3f8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                local_3f8._24_2_ = (undefined2)plVar11[3];
                local_3f8._26_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                local_3f8._0_8_ = pbVar2;
              }
              else {
                pcVar3 = (pbVar1->_M_dataplus)._M_p;
                local_3f8._16_2_ = SUB82(pcVar3,0);
                local_3f8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                local_3f8._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11;
              }
              local_3f8._8_2_ = (undefined2)plVar11[1];
              local_3f8._10_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
              *plVar11 = (long)pbVar1;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_3f8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3f8._0_8_ != pbVar2) {
                operator_delete((void *)local_3f8._0_8_,
                                CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
              }
              if (local_420 != &local_410) {
                operator_delete(local_420,(ulong)(local_410 + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_148);
            iVar9 = 1;
            goto LAB_001f95bf;
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460._M_p !=
            &bStack_450) {
          operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
        }
        if (!bVar25) goto LAB_001fb61d;
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"rotations","");
        sVar7 = local_2e0._M_string_length;
        sVar5 = local_388._M_string_length;
        local_418 = &local_408;
        local_410 = (char *)0x0;
        local_408 = 0;
        sVar16 = local_2e0._M_string_length;
        if (local_388._M_string_length < local_2e0._M_string_length) {
          sVar16 = local_388._M_string_length;
        }
        if (sVar16 == 0) {
          if (local_2e0._M_string_length == local_388._M_string_length) goto LAB_001f969b;
LAB_001f9853:
          local_420 = (char **)CONCAT44(local_420._4_4_,1);
        }
        else {
          iVar9 = bcmp(local_2e0._M_dataplus._M_p,local_388._M_dataplus._M_p,sVar16);
          if ((sVar7 != sVar5) || (iVar9 != 0)) goto LAB_001f9853;
LAB_001f969b:
          if (((ulong)p_Var15[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            local_420 = (char **)CONCAT44(local_420._4_4_,7);
            local_468 = (undefined1  [8])auStack_458;
            local_3f8._0_8_ = &DAT_0000003e;
            local_468 = (undefined1  [8])
                        ::std::__cxx11::string::_M_create((ulong *)local_468,(ulong)local_3f8);
            auStack_458 = (undefined1  [8])local_3f8._0_8_;
            *(undefined8 *)local_468 = 0x79747265706f7250;
            *(undefined8 *)((long)local_468 + 8) = 0x756d20607d7b6020;
            *(undefined8 *)((long)local_468 + 0x10) = 0x7441206562207473;
            *(undefined8 *)((long)local_468 + 0x18) = 0x2c65747562697274;
            *(undefined8 *)((long)local_468 + 0x20) = 0x6365642074756220;
            *(undefined8 *)((long)local_468 + 0x28) = 0x736120646572616c;
            builtin_strncpy((char *)((long)local_468 + 0x2e),"as Relat",8);
            builtin_strncpy((char *)((long)local_468 + 0x36),"ionship.",8);
            local_460._M_p = (pointer)local_3f8._0_8_;
            *(char *)((long)local_468 + local_3f8._0_8_) = '\0';
            fmt::format<std::__cxx11::string>
                      ((string *)local_1b8,(fmt *)local_468,&local_388,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3f8._0_8_);
            ::std::__cxx11::string::operator=((string *)&local_418,(string *)local_1b8);
            if (local_1b8 != (undefined1  [8])(local_1b0 + 8)) {
              operator_delete((void *)local_1b8,(ulong)(aStack_1a8._M_allocated_capacity + 1));
            }
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
          }
          if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_290,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var15[6]._M_parent);
            local_420 = (char **)((ulong)local_420 & 0xffffffff00000000);
          }
          Attribute::type_name_abi_cxx11_(&local_368,local_3b0);
          tinyusdz::value::
          TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
          type_name_abi_cxx11_();
          auVar22 = local_1b8;
          if ((local_1b0 != (undefined1  [8])local_368._M_string_length) ||
             ((bVar25 = true, local_1b0 != (undefined1  [8])0x0 &&
              (iVar9 = bcmp((void *)local_1b8,local_368._M_dataplus._M_p,(size_t)local_1b0),
              iVar9 != 0)))) {
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
            underlying_type_name_abi_cxx11_();
            auVar4 = local_468;
            if (local_460._M_p == (pointer)local_368._M_string_length) {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_460._M_p ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar25 = true;
              }
              else {
                iVar9 = bcmp((void *)local_468,local_368._M_dataplus._M_p,(size_t)local_460._M_p);
                bVar25 = iVar9 == 0;
              }
            }
            else {
              bVar25 = false;
            }
            auVar22 = local_1b8;
            if (auVar4 != (undefined1  [8])auStack_458) {
              operator_delete((void *)auVar4,(ulong)((long)auStack_458 + 1));
              auVar22 = local_1b8;
            }
          }
          if (auVar22 != (undefined1  [8])(local_1b0 + 8)) {
            operator_delete((void *)auVar22,(ulong)(aStack_1a8._M_allocated_capacity + 1));
          }
          if (bVar25) {
            iVar9 = *(int *)((long)&p_Var15[0x17]._M_parent + 4);
            if (iVar9 == 1) {
              if (p_Var15[5]._M_left == p_Var15[5]._M_parent) {
                if (p_Var15[4]._M_right == (_Base_ptr)0x0) {
                  bVar25 = false;
                }
                else {
                  iVar9 = (**(code **)p_Var15[4]._M_right)();
                  bVar25 = iVar9 == 4;
                }
                uVar8 = (undefined1)p_Var15[5]._M_color;
                if ((bVar25) || ((uVar8 & _S_black) != _S_red)) {
                  (local_348->rotations)._blocked = true;
                }
              }
              else {
                uVar8 = (undefined1)p_Var15[5]._M_color;
              }
              if (((((uVar8 & _S_black) == _S_red) && (p_Var15[4]._M_right != (_Base_ptr)0x0)) &&
                  ((iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 0 ||
                   ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                    (iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 1)))))) &&
                 (p_Var15[5]._M_left == p_Var15[5]._M_parent)) {
                if (p_Var15[6]._M_left == p_Var15[6]._M_parent) goto LAB_001f9f2b;
                AttrMetas::operator=(local_330,(AttrMetas *)(p_Var15 + 7));
                psVar20 = (string *)&local_2e0;
                goto LAB_001f9f1e;
              }
              uStack_3c8 = 0;
              uStack_3c7 = 0;
              uStack_3c0 = 0;
              local_3d8._M_allocated_capacity = 0;
              local_3d8._M_local_buf[8] = '\0';
              local_3d8._9_7_ = 0;
              local_3f8._16_2_ = 0;
              local_3f8._18_6_ = 0;
              local_3f8._24_2_ = 0;
              local_3f8._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_3f8._8_2_ = 0;
              local_3f8._10_6_ = 0;
              bVar25 = primvar::PrimVar::is_valid((PrimVar *)&p_Var15[4]._M_parent);
              if (bVar25) {
                if ((((char)p_Var15[5]._M_color == _S_red) &&
                    (p_Var15[4]._M_right != (_Base_ptr)0x0)) &&
                   ((iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 0 ||
                    ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                     (iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 1)))))) {
                  bVar17 = 0;
                }
                else {
                  primvar::PrimVar::
                  get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                            (&local_328,(PrimVar *)&p_Var15[4]._M_parent);
                  bVar17 = local_328.has_value_;
                  local_3a8 = local_328.has_value_;
                  if (local_328.has_value_ != false) {
                    local_3a0.
                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)local_328.contained.data._0_8_;
                    local_3a0.
                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_328.contained._8_8_;
                    local_3a0.
                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_328.contained._16_8_;
                    ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                    operator=((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               *)local_3f8,
                              (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               *)&local_3a0);
                    local_3f8._24_2_ = 1;
                  }
                  if (((local_3a8 & 1) != 0) &&
                     ((anon_struct_8_0_00000001_for___align)
                      local_3a0.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (anon_struct_8_0_00000001_for___align)0x0)) {
                    operator_delete(local_3a0.
                                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_3a0.
                                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_3a0.
                                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                pSVar23 = (pointer)p_Var15[5]._M_parent;
                if ((pointer)p_Var15[5]._M_left == pSVar23) {
                  if (bVar17 == 0) {
                    local_430 = 0;
                    uStack_428 = 0;
                    bStack_450.field_2._M_allocated_capacity = 0;
                    bStack_450.field_2._8_8_ = 0;
                    bStack_450._M_dataplus._M_p = (pointer)0x0;
                    bStack_450._M_string_length = 0;
                    local_460._M_p = (pointer)0x0;
                    auStack_458 = (undefined1  [8])0x0;
LAB_001f9df4:
                    local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
                    cVar18 = '\0';
                    goto LAB_001f9dfe;
                  }
                }
                else {
                  local_338 = (TimeSamples *)&p_Var15[5]._M_parent;
                  lVar24 = 0;
                  uVar19 = 0;
                  do {
                    pTVar6 = local_338;
                    if ((char)p_Var15[6]._M_color == _S_black) {
                      tinyusdz::value::TimeSamples::update(local_338);
                      pSVar23 = (pTVar6->_samples).
                                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    if ((&pSVar23->blocked)[lVar24] == true) {
                      TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                      ::add_blocked_sample
                                ((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                  *)&local_3d8,*(double *)((long)&pSVar23->t + lVar24));
                    }
                    else {
                      tinyusdz::value::Value::
                      get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                                (&local_328,(Value *)((long)&(pSVar23->value).v_.storage + lVar24),
                                 false);
                      bVar25 = local_328.has_value_;
                      local_3a8 = local_328.has_value_;
                      if (local_328.has_value_ == true) {
                        local_3a0.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)local_328.contained.data._0_8_;
                        local_3a0.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             (pointer)local_328.contained._8_8_;
                        local_3a0.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)local_328.contained._16_8_;
                        TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::add_sample((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                      *)&local_3d8,*(double *)((long)&pSVar23->t + lVar24),
                                     (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                      *)&local_3a0);
                      }
                      else {
                        local_430 = 0;
                        uStack_428 = 0;
                        bStack_450.field_2._M_allocated_capacity = 0;
                        bStack_450.field_2._8_8_ = 0;
                        bStack_450._M_dataplus._M_p = (pointer)0x0;
                        bStack_450._M_string_length = 0;
                        local_460._M_p = (pointer)0x0;
                        auStack_458 = (undefined1  [8])0x0;
                      }
                      if (((local_3a8 & 1) != 0) &&
                         ((anon_struct_8_0_00000001_for___align)
                          local_3a0.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (anon_struct_8_0_00000001_for___align)0x0)) {
                        operator_delete(local_3a0.
                                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_3a0.
                                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_3a0.
                                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar25 == false) goto LAB_001f9df4;
                    }
                    uVar19 = uVar19 + 1;
                    pSVar23 = (pointer)p_Var15[5]._M_parent;
                    lVar24 = lVar24 + 0x28;
                  } while (uVar19 < (ulong)(((long)p_Var15[5]._M_left - (long)pSVar23 >> 3) *
                                           -0x3333333333333333));
                }
                local_468[0] = 1;
                auStack_458 = (undefined1  [8])CONCAT62(local_3f8._10_6_,local_3f8._8_2_);
                local_460._M_p = (pointer)local_3f8._0_8_;
                bStack_450._M_dataplus._M_p = (pointer)CONCAT62(local_3f8._18_6_,local_3f8._16_2_);
                local_3f8._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_3f8._8_2_ = 0;
                local_3f8._10_6_ = 0;
                local_3f8._16_2_ = 0;
                local_3f8._18_6_ = 0;
                bStack_450._M_string_length =
                     CONCAT62(bStack_450._M_string_length._2_6_,local_3f8._24_2_);
                bStack_450.field_2._8_8_ = CONCAT71(local_3d8._9_7_,local_3d8._M_local_buf[8]);
                bStack_450.field_2._M_allocated_capacity = local_3d8._M_allocated_capacity;
                local_430 = CONCAT71(uStack_3c7,uStack_3c8);
                uStack_3c8 = 0;
                uStack_3c7 = 0;
                local_3d8._M_allocated_capacity = 0;
                local_3d8._M_local_buf[8] = '\0';
                local_3d8._9_7_ = 0;
                uStack_428 = CONCAT71(uStack_428._1_7_,uStack_3c0);
                cVar18 = '\x01';
              }
              else {
                local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
                local_430 = 0;
                uStack_428 = 0;
                bStack_450.field_2._M_allocated_capacity = 0;
                bStack_450.field_2._8_8_ = 0;
                bStack_450._M_dataplus._M_p = (pointer)0x0;
                bStack_450._M_string_length = 0;
                local_460._M_p = (pointer)0x0;
                auStack_458 = (undefined1  [8])0x0;
                cVar18 = '\0';
              }
LAB_001f9dfe:
              ::std::
              vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
              ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                         *)&local_3d8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3f8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                operator_delete((void *)local_3f8._0_8_,
                                CONCAT62(local_3f8._18_6_,local_3f8._16_2_) - local_3f8._0_8_);
              }
              local_1b8[0] = (ostringstream)cVar18;
              if (cVar18 == '\0') {
                local_420 = (char **)CONCAT44(local_420._4_4_,8);
                pPVar21 = (Property *)0x55;
                ::std::__cxx11::string::_M_replace((ulong)&local_418,0,local_410,0x3df346);
              }
              else {
                local_1b0 = (undefined1  [8])local_460._M_p;
                aStack_1a8._M_allocated_capacity = (size_type)auStack_458;
                aStack_1a8._8_8_ = bStack_450._M_dataplus._M_p;
                bStack_450._M_dataplus._M_p = (pointer)0x0;
                local_460._M_p = (pointer)0x0;
                auStack_458 = (undefined1  [8])0x0;
                local_198 = (undefined2)bStack_450._M_string_length;
                local_190._M_p = (pointer)bStack_450.field_2._M_allocated_capacity;
                pSStack_188 = (pointer)bStack_450.field_2._8_8_;
                local_180[0]._M_allocated_capacity = local_430;
                local_430 = 0;
                bStack_450.field_2._M_allocated_capacity = 0;
                bStack_450.field_2._8_8_ = 0;
                local_180[0]._M_local_buf[8] = (char)uStack_428;
                nonstd::optional_lite::detail::
                storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                  *)&local_460);
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                ::operator=(local_2b0,
                            (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                             *)local_1b0);
              }
              if (local_1b8[0] == (ostringstream)0x1) {
                nonstd::optional_lite::detail::
                storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                  *)local_1b0);
              }
              if (cVar18 != '\0') goto LAB_001f9efe;
            }
            else if (iVar9 == 0) {
              (local_348->rotations)._value_empty = true;
LAB_001f9efe:
              AttrMetas::operator=(local_330,(AttrMetas *)(p_Var15 + 7));
              psVar20 = &local_388;
LAB_001f9f1e:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar20);
              local_420 = (char **)((ulong)local_420 & 0xffffffff00000000);
            }
            else {
              pPVar21 = (Property *)0x25;
              ::std::__cxx11::string::_M_replace((ulong)&local_418,0,local_410,0x3df078);
              local_420 = (char **)CONCAT44(local_420._4_4_,8);
            }
          }
          else {
            local_420 = (char **)CONCAT44(local_420._4_4_,3);
            ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0 + 8),"Property type mismatch. ",0x18);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_1b0 + 8),local_388._M_dataplus._M_p,
                                 local_388._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," expects type `",0xf);
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
            type_name_abi_cxx11_();
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)local_468,(long)local_460._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"` but defined as type `",0x17);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_368._M_dataplus._M_p,local_368._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"`",1);
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)&local_418,(string *)local_468);
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
            ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_308);
          }
LAB_001f9f2b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        iVar9 = 0;
        if (((ulong)local_420 & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_001fa1d5:
          bVar25 = false;
        }
        else {
          bVar25 = true;
          if ((int)local_420 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbb1);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_3f8 + 0x10);
            local_3f8._0_8_ = pbVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[10],std::__cxx11::string>
                      ((string *)local_468,(fmt *)local_3f8,(string *)"rotations",
                       (char (*) [10])&local_418,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar21)
            ;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,(char *)local_468,(long)local_460._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
                != pbVar2) {
              operator_delete((void *)local_3f8._0_8_,
                              CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar12 = (undefined8 *)
                        ::std::__cxx11::string::_M_append(local_3f8,(ulong)(err->_M_dataplus)._M_p);
              plVar11 = puVar12 + 2;
              if ((long *)*puVar12 == plVar11) {
                auStack_458 = (undefined1  [8])*plVar11;
                bStack_450._M_dataplus._M_p = (pointer)puVar12[3];
                local_468 = (undefined1  [8])auStack_458;
              }
              else {
                auStack_458 = (undefined1  [8])*plVar11;
                local_468 = (undefined1  [8])*puVar12;
              }
              local_460._M_p = (pointer)puVar12[1];
              *puVar12 = plVar11;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_468);
              if (local_468 != (undefined1  [8])auStack_458) {
                operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3f8._0_8_ != pbVar2) {
                operator_delete((void *)local_3f8._0_8_,
                                CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_148);
            iVar9 = 1;
            goto LAB_001fa1d5;
          }
        }
        if (local_418 != &local_408) {
          operator_delete(local_418,CONCAT71(uStack_407,local_408) + 1);
        }
        if (!bVar25) goto LAB_001fb61d;
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_300,*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"scales","");
        sVar7 = local_300._M_string_length;
        sVar5 = local_388._M_string_length;
        local_418 = &local_408;
        local_410 = (char *)0x0;
        local_408 = 0;
        sVar16 = local_300._M_string_length;
        if (local_388._M_string_length < local_300._M_string_length) {
          sVar16 = local_388._M_string_length;
        }
        if (sVar16 == 0) {
          if (local_300._M_string_length == local_388._M_string_length) goto LAB_001fa2b1;
LAB_001fa469:
          local_420 = (char **)CONCAT44(local_420._4_4_,1);
        }
        else {
          iVar9 = bcmp(local_300._M_dataplus._M_p,local_388._M_dataplus._M_p,sVar16);
          if ((sVar7 != sVar5) || (iVar9 != 0)) goto LAB_001fa469;
LAB_001fa2b1:
          if (((ulong)p_Var15[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            local_420 = (char **)CONCAT44(local_420._4_4_,7);
            local_468 = (undefined1  [8])auStack_458;
            local_3f8._0_8_ = &DAT_0000003e;
            local_468 = (undefined1  [8])
                        ::std::__cxx11::string::_M_create((ulong *)local_468,(ulong)local_3f8);
            auStack_458 = (undefined1  [8])local_3f8._0_8_;
            *(undefined8 *)local_468 = 0x79747265706f7250;
            *(undefined8 *)((long)local_468 + 8) = 0x756d20607d7b6020;
            *(undefined8 *)((long)local_468 + 0x10) = 0x7441206562207473;
            *(undefined8 *)((long)local_468 + 0x18) = 0x2c65747562697274;
            *(undefined8 *)((long)local_468 + 0x20) = 0x6365642074756220;
            *(undefined8 *)((long)local_468 + 0x28) = 0x736120646572616c;
            builtin_strncpy((char *)((long)local_468 + 0x2e),"as Relat",8);
            builtin_strncpy((char *)((long)local_468 + 0x36),"ionship.",8);
            local_460._M_p = (pointer)local_3f8._0_8_;
            *(char *)((long)local_468 + local_3f8._0_8_) = '\0';
            fmt::format<std::__cxx11::string>
                      ((string *)local_1b8,(fmt *)local_468,&local_388,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3f8._0_8_);
            ::std::__cxx11::string::operator=((string *)&local_418,(string *)local_1b8);
            if (local_1b8 != (undefined1  [8])(local_1b0 + 8)) {
              operator_delete((void *)local_1b8,(ulong)(aStack_1a8._M_allocated_capacity + 1));
            }
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
          }
          if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_2a0,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var15[6]._M_parent);
            local_420 = (char **)((ulong)local_420 & 0xffffffff00000000);
          }
          Attribute::type_name_abi_cxx11_(&local_368,local_3b0);
          tinyusdz::value::
          TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
          ::type_name_abi_cxx11_();
          auVar22 = local_1b8;
          if ((local_1b0 != (undefined1  [8])local_368._M_string_length) ||
             ((bVar25 = true, local_1b0 != (undefined1  [8])0x0 &&
              (iVar9 = bcmp((void *)local_1b8,local_368._M_dataplus._M_p,(size_t)local_1b0),
              iVar9 != 0)))) {
            tinyusdz::value::
            TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
            ::underlying_type_name_abi_cxx11_();
            auVar4 = local_468;
            if (local_460._M_p == (pointer)local_368._M_string_length) {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_460._M_p ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar25 = true;
              }
              else {
                iVar9 = bcmp((void *)local_468,local_368._M_dataplus._M_p,(size_t)local_460._M_p);
                bVar25 = iVar9 == 0;
              }
            }
            else {
              bVar25 = false;
            }
            auVar22 = local_1b8;
            if (auVar4 != (undefined1  [8])auStack_458) {
              operator_delete((void *)auVar4,(ulong)((long)auStack_458 + 1));
              auVar22 = local_1b8;
            }
          }
          if (auVar22 != (undefined1  [8])(local_1b0 + 8)) {
            operator_delete((void *)auVar22,(ulong)(aStack_1a8._M_allocated_capacity + 1));
          }
          if (bVar25) {
            iVar9 = *(int *)((long)&p_Var15[0x17]._M_parent + 4);
            if (iVar9 == 1) {
              if (p_Var15[5]._M_left == p_Var15[5]._M_parent) {
                if (p_Var15[4]._M_right == (_Base_ptr)0x0) {
                  bVar25 = false;
                }
                else {
                  iVar9 = (**(code **)p_Var15[4]._M_right)();
                  bVar25 = iVar9 == 4;
                }
                uVar8 = (undefined1)p_Var15[5]._M_color;
                if ((bVar25) || ((uVar8 & _S_black) != _S_red)) {
                  (local_348->scales)._blocked = true;
                }
              }
              else {
                uVar8 = (undefined1)p_Var15[5]._M_color;
              }
              if (((((uVar8 & _S_black) == _S_red) && (p_Var15[4]._M_right != (_Base_ptr)0x0)) &&
                  ((iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 0 ||
                   ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                    (iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 1)))))) &&
                 (p_Var15[5]._M_left == p_Var15[5]._M_parent)) {
                if (p_Var15[6]._M_left == p_Var15[6]._M_parent) goto LAB_001fab7c;
                AttrMetas::operator=(local_340,(AttrMetas *)(p_Var15 + 7));
                psVar20 = (string *)&local_300;
                goto LAB_001fab6f;
              }
              uStack_3c8 = 0;
              uStack_3c7 = 0;
              uStack_3c0 = 0;
              local_3d8._M_allocated_capacity = 0;
              local_3d8._M_local_buf[8] = '\0';
              local_3d8._9_7_ = 0;
              local_3f8._16_2_ = 0;
              local_3f8._18_6_ = 0;
              local_3f8._24_2_ = 0;
              local_3f8._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_3f8._8_2_ = 0;
              local_3f8._10_6_ = 0;
              bVar25 = primvar::PrimVar::is_valid((PrimVar *)&p_Var15[4]._M_parent);
              if (bVar25) {
                if ((((char)p_Var15[5]._M_color == _S_red) &&
                    (p_Var15[4]._M_right != (_Base_ptr)0x0)) &&
                   ((iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 0 ||
                    ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                     (iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 1)))))) {
                  bVar17 = 0;
                }
                else {
                  primvar::PrimVar::
                  get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                            ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                              *)&local_328,(PrimVar *)&p_Var15[4]._M_parent);
                  bVar17 = local_328.has_value_;
                  local_3a8 = local_328.has_value_;
                  if (local_328.has_value_ != false) {
                    local_3a0.
                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)local_328.contained.data._0_8_;
                    local_3a0.
                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_328.contained._8_8_;
                    local_3a0.
                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_328.contained._16_8_;
                    ::std::
                    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                 *)local_3f8,&local_3a0);
                    local_3f8._24_2_ = 1;
                  }
                  if (((local_3a8 & 1) != 0) &&
                     ((anon_struct_8_0_00000001_for___align)
                      local_3a0.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (anon_struct_8_0_00000001_for___align)0x0)) {
                    operator_delete(local_3a0.
                                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_3a0.
                                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_3a0.
                                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                pSVar23 = (pointer)p_Var15[5]._M_parent;
                if ((pointer)p_Var15[5]._M_left == pSVar23) {
                  if (bVar17 == 0) {
                    local_430 = 0;
                    uStack_428 = 0;
                    bStack_450.field_2._M_allocated_capacity = 0;
                    bStack_450.field_2._8_8_ = 0;
                    bStack_450._M_dataplus._M_p = (pointer)0x0;
                    bStack_450._M_string_length = 0;
                    local_460._M_p = (pointer)0x0;
                    auStack_458 = (undefined1  [8])0x0;
LAB_001faa45:
                    local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
                    cVar18 = '\0';
                    goto LAB_001faa4f;
                  }
                }
                else {
                  local_338 = (TimeSamples *)&p_Var15[5]._M_parent;
                  lVar24 = 0;
                  uVar19 = 0;
                  do {
                    pTVar6 = local_338;
                    if ((char)p_Var15[6]._M_color == _S_black) {
                      tinyusdz::value::TimeSamples::update(local_338);
                      pSVar23 = (pTVar6->_samples).
                                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    if ((&pSVar23->blocked)[lVar24] == true) {
                      TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                      ::add_blocked_sample
                                ((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                  *)&local_3d8,*(double *)((long)&pSVar23->t + lVar24));
                    }
                    else {
                      tinyusdz::value::Value::
                      get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                  *)&local_328,
                                 (Value *)((long)&(pSVar23->value).v_.storage + lVar24),false);
                      bVar25 = local_328.has_value_;
                      local_3a8 = local_328.has_value_;
                      if (local_328.has_value_ == true) {
                        local_3a0.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)local_328.contained.data._0_8_;
                        local_3a0.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             (pointer)local_328.contained._8_8_;
                        local_3a0.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)local_328.contained._16_8_;
                        TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        ::add_sample((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                      *)&local_3d8,*(double *)((long)&pSVar23->t + lVar24),
                                     &local_3a0);
                      }
                      else {
                        local_430 = 0;
                        uStack_428 = 0;
                        bStack_450.field_2._M_allocated_capacity = 0;
                        bStack_450.field_2._8_8_ = 0;
                        bStack_450._M_dataplus._M_p = (pointer)0x0;
                        bStack_450._M_string_length = 0;
                        local_460._M_p = (pointer)0x0;
                        auStack_458 = (undefined1  [8])0x0;
                      }
                      if (((local_3a8 & 1) != 0) &&
                         ((anon_struct_8_0_00000001_for___align)
                          local_3a0.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (anon_struct_8_0_00000001_for___align)0x0)) {
                        operator_delete(local_3a0.
                                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_3a0.
                                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_3a0.
                                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar25 == false) goto LAB_001faa45;
                    }
                    uVar19 = uVar19 + 1;
                    pSVar23 = (pointer)p_Var15[5]._M_parent;
                    lVar24 = lVar24 + 0x28;
                  } while (uVar19 < (ulong)(((long)p_Var15[5]._M_left - (long)pSVar23 >> 3) *
                                           -0x3333333333333333));
                }
                local_468[0] = 1;
                auStack_458 = (undefined1  [8])CONCAT62(local_3f8._10_6_,local_3f8._8_2_);
                local_460._M_p = (pointer)local_3f8._0_8_;
                bStack_450._M_dataplus._M_p = (pointer)CONCAT62(local_3f8._18_6_,local_3f8._16_2_);
                local_3f8._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_3f8._8_2_ = 0;
                local_3f8._10_6_ = 0;
                local_3f8._16_2_ = 0;
                local_3f8._18_6_ = 0;
                bStack_450._M_string_length =
                     CONCAT62(bStack_450._M_string_length._2_6_,local_3f8._24_2_);
                bStack_450.field_2._8_8_ = CONCAT71(local_3d8._9_7_,local_3d8._M_local_buf[8]);
                bStack_450.field_2._M_allocated_capacity = local_3d8._M_allocated_capacity;
                local_430 = CONCAT71(uStack_3c7,uStack_3c8);
                uStack_3c8 = 0;
                uStack_3c7 = 0;
                local_3d8._M_allocated_capacity = 0;
                local_3d8._M_local_buf[8] = '\0';
                local_3d8._9_7_ = 0;
                uStack_428 = CONCAT71(uStack_428._1_7_,uStack_3c0);
                cVar18 = '\x01';
              }
              else {
                local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
                local_430 = 0;
                uStack_428 = 0;
                bStack_450.field_2._M_allocated_capacity = 0;
                bStack_450.field_2._8_8_ = 0;
                bStack_450._M_dataplus._M_p = (pointer)0x0;
                bStack_450._M_string_length = 0;
                local_460._M_p = (pointer)0x0;
                auStack_458 = (undefined1  [8])0x0;
                cVar18 = '\0';
              }
LAB_001faa4f:
              ::std::
              vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                         *)&local_3d8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3f8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                operator_delete((void *)local_3f8._0_8_,
                                CONCAT62(local_3f8._18_6_,local_3f8._16_2_) - local_3f8._0_8_);
              }
              local_1b8[0] = (ostringstream)cVar18;
              if (cVar18 == '\0') {
                local_420 = (char **)CONCAT44(local_420._4_4_,8);
                pPVar21 = (Property *)0x55;
                ::std::__cxx11::string::_M_replace((ulong)&local_418,0,local_410,0x3df346);
              }
              else {
                local_1b0 = (undefined1  [8])local_460._M_p;
                aStack_1a8._M_allocated_capacity = (size_type)auStack_458;
                aStack_1a8._8_8_ = bStack_450._M_dataplus._M_p;
                bStack_450._M_dataplus._M_p = (pointer)0x0;
                local_460._M_p = (pointer)0x0;
                auStack_458 = (undefined1  [8])0x0;
                local_198 = (undefined2)bStack_450._M_string_length;
                local_190._M_p = (pointer)bStack_450.field_2._M_allocated_capacity;
                pSStack_188 = (pointer)bStack_450.field_2._8_8_;
                local_180[0]._M_allocated_capacity = local_430;
                local_430 = 0;
                bStack_450.field_2._M_allocated_capacity = 0;
                bStack_450.field_2._8_8_ = 0;
                local_180[0]._M_local_buf[8] = (char)uStack_428;
                nonstd::optional_lite::detail::
                storage_t<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                  *)&local_460);
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                ::operator=(local_2c0,
                            (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                             *)local_1b0);
              }
              if (local_1b8[0] == (ostringstream)0x1) {
                nonstd::optional_lite::detail::
                storage_t<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                  *)local_1b0);
              }
              if (cVar18 != '\0') goto LAB_001fab4f;
            }
            else if (iVar9 == 0) {
              (local_348->scales)._value_empty = true;
LAB_001fab4f:
              AttrMetas::operator=(local_340,(AttrMetas *)(p_Var15 + 7));
              psVar20 = &local_388;
LAB_001fab6f:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar20);
              local_420 = (char **)((ulong)local_420 & 0xffffffff00000000);
            }
            else {
              pPVar21 = (Property *)0x25;
              ::std::__cxx11::string::_M_replace((ulong)&local_418,0,local_410,0x3df078);
              local_420 = (char **)CONCAT44(local_420._4_4_,8);
            }
          }
          else {
            local_420 = (char **)CONCAT44(local_420._4_4_,3);
            ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0 + 8),"Property type mismatch. ",0x18);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_1b0 + 8),local_388._M_dataplus._M_p,
                                 local_388._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," expects type `",0xf);
            tinyusdz::value::
            TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
            ::type_name_abi_cxx11_();
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)local_468,(long)local_460._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"` but defined as type `",0x17);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_368._M_dataplus._M_p,local_368._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"`",1);
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)&local_418,(string *)local_468);
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
            ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_308);
          }
LAB_001fab7c:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        iVar9 = 0;
        if (((ulong)local_420 & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_001fae26:
          bVar25 = false;
        }
        else {
          bVar25 = true;
          if ((int)local_420 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbb2);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_3f8 + 0x10);
            local_3f8._0_8_ = pbVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[7],std::__cxx11::string>
                      ((string *)local_468,(fmt *)local_3f8,(string *)"scales",
                       (char (*) [7])&local_418,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar21)
            ;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,(char *)local_468,(long)local_460._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
                != pbVar2) {
              operator_delete((void *)local_3f8._0_8_,
                              CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar12 = (undefined8 *)
                        ::std::__cxx11::string::_M_append(local_3f8,(ulong)(err->_M_dataplus)._M_p);
              plVar11 = puVar12 + 2;
              if ((long *)*puVar12 == plVar11) {
                auStack_458 = (undefined1  [8])*plVar11;
                bStack_450._M_dataplus._M_p = (pointer)puVar12[3];
                local_468 = (undefined1  [8])auStack_458;
              }
              else {
                auStack_458 = (undefined1  [8])*plVar11;
                local_468 = (undefined1  [8])*puVar12;
              }
              local_460._M_p = (pointer)puVar12[1];
              *puVar12 = plVar11;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_468);
              if (local_468 != (undefined1  [8])auStack_458) {
                operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3f8._0_8_ != pbVar2) {
                operator_delete((void *)local_3f8._0_8_,
                                CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_148);
            iVar9 = 1;
            goto LAB_001fae26;
          }
        }
        if (local_418 != &local_408) {
          operator_delete(local_418,CONCAT71(uStack_407,local_408) + 1);
        }
        if (!bVar25) goto LAB_001fb61d;
        local_218[0] = local_208;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        local_1b8 = (undefined1  [8])(local_1b0 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"blendShapes","");
        pPVar21 = (Property *)local_1b8;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  ((ParseResult *)local_468,local_268,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_218,&local_3b0->_name,(Property *)local_1b8,local_298,
                   (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                    *)in_stack_fffffffffffffb88);
        if (local_1b8 != (undefined1  [8])(local_1b0 + 8)) {
          operator_delete((void *)local_1b8,(ulong)(aStack_1a8._M_allocated_capacity + 1));
        }
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        iVar9 = 0;
        if (((ulong)local_468 & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_001fb14b:
          bVar25 = false;
        }
        else {
          bVar25 = true;
          if (local_468._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbb3);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            local_420 = &local_410;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_420,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[12],std::__cxx11::string>
                      ((string *)local_3f8,(fmt *)&local_420,(string *)0x3de910,
                       (char (*) [12])&local_460,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar21)
            ;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,(char *)local_3f8._0_8_,
                                 CONCAT62(local_3f8._10_6_,local_3f8._8_2_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_3f8 + 0x10);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
                != pbVar2) {
              operator_delete((void *)local_3f8._0_8_,
                              CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
            }
            if (local_420 != &local_410) {
              operator_delete(local_420,(ulong)(local_410 + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar11 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_420,(ulong)(err->_M_dataplus)._M_p);
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar11 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11 ==
                  pbVar1) {
                pcVar3 = (pbVar1->_M_dataplus)._M_p;
                local_3f8._16_2_ = SUB82(pcVar3,0);
                local_3f8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                local_3f8._24_2_ = (undefined2)plVar11[3];
                local_3f8._26_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                local_3f8._0_8_ = pbVar2;
              }
              else {
                pcVar3 = (pbVar1->_M_dataplus)._M_p;
                local_3f8._16_2_ = SUB82(pcVar3,0);
                local_3f8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                local_3f8._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11;
              }
              local_3f8._8_2_ = (undefined2)plVar11[1];
              local_3f8._10_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
              *plVar11 = (long)pbVar1;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_3f8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3f8._0_8_ != pbVar2) {
                operator_delete((void *)local_3f8._0_8_,
                                CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
              }
              if (local_420 != &local_410) {
                operator_delete(local_420,(ulong)(local_410 + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_148);
            iVar9 = 1;
            goto LAB_001fb14b;
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460._M_p !=
            &bStack_450) {
          operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
        }
        if (!bVar25) goto LAB_001fb61d;
        local_238[0] = local_228;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        local_1b8 = (undefined1  [8])(local_1b0 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"blendShapeWeights","");
        pPVar21 = (Property *)local_1b8;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                  ((ParseResult *)local_468,local_268,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_238,&local_3b0->_name,(Property *)local_1b8,local_2a8,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                    *)in_stack_fffffffffffffb88);
        if (local_1b8 != (undefined1  [8])(local_1b0 + 8)) {
          operator_delete((void *)local_1b8,(ulong)(aStack_1a8._M_allocated_capacity + 1));
        }
        if (local_238[0] != local_228) {
          operator_delete(local_238[0],local_228[0] + 1);
        }
        iVar9 = 0;
        if (((ulong)local_468 & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_001fb470:
          bVar25 = false;
        }
        else {
          bVar25 = true;
          if (local_468._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbb4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            local_420 = &local_410;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_420,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[18],std::__cxx11::string>
                      ((string *)local_3f8,(fmt *)&local_420,(string *)"blendShapeWeights",
                       (char (*) [18])&local_460,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar21)
            ;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,(char *)local_3f8._0_8_,
                                 CONCAT62(local_3f8._10_6_,local_3f8._8_2_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_3f8 + 0x10);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
                != pbVar2) {
              operator_delete((void *)local_3f8._0_8_,
                              CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
            }
            if (local_420 != &local_410) {
              operator_delete(local_420,(ulong)(local_410 + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar11 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_420,(ulong)(err->_M_dataplus)._M_p);
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar11 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11 ==
                  pbVar1) {
                pcVar3 = (pbVar1->_M_dataplus)._M_p;
                local_3f8._16_2_ = SUB82(pcVar3,0);
                local_3f8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                local_3f8._24_2_ = (undefined2)plVar11[3];
                local_3f8._26_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                local_3f8._0_8_ = pbVar2;
              }
              else {
                pcVar3 = (pbVar1->_M_dataplus)._M_p;
                local_3f8._16_2_ = SUB82(pcVar3,0);
                local_3f8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                local_3f8._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11;
              }
              local_3f8._8_2_ = (undefined2)plVar11[1];
              local_3f8._10_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
              *plVar11 = (long)pbVar1;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_3f8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3f8._0_8_ != pbVar2) {
                operator_delete((void *)local_3f8._0_8_,
                                CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
              }
              if (local_420 != &local_410) {
                operator_delete(local_420,(ulong)(local_410 + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_148);
            iVar9 = 1;
            goto LAB_001fb470;
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460._M_p !=
            &bStack_450) {
          operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
        }
        if (!bVar25) goto LAB_001fb61d;
        __k = p_Var15 + 1;
        cVar13 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_268,(key_type *)__k);
        if (cVar13._M_node == &local_260) {
          pmVar14 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_2b8,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar14);
          (pmVar14->_attrib)._varying_authored = (bool)p_Var15[3].field_0x4;
          (pmVar14->_attrib)._variability = p_Var15[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar14->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar14->_attrib)._var,(any *)&p_Var15[4]._M_parent);
          (pmVar14->_attrib)._var._blocked = SUB41(p_Var15[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar14->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var15[5]._M_parent);
          (pmVar14->_attrib)._var._ts._dirty = SUB41(p_Var15[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar14->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var15[6]._M_parent);
          AttrMetas::operator=(&(pmVar14->_attrib)._metas,(AttrMetas *)(p_Var15 + 7));
          *(_Base_ptr *)&pmVar14->_listOpQual = p_Var15[0x17]._M_parent;
          (pmVar14->_rel).type = *(Type *)&p_Var15[0x17]._M_left;
          Path::operator=(&(pmVar14->_rel).targetPath,(Path *)&p_Var15[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar14->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var15[0x1e]._M_parent);
          (pmVar14->_rel).listOpQual = p_Var15[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar14->_rel)._metas,(AttrMetas *)&p_Var15[0x1f]._M_parent);
          (pmVar14->_rel)._varying_authored = *(bool *)&p_Var15[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar14->_prop_value_type_name);
          pmVar14->_has_custom = *(bool *)&p_Var15[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
        cVar13 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_268,(key_type *)__k);
        if (cVar13._M_node == &local_260) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0xbb6);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_468,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,(char *)local_468,(long)local_460._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if (local_468 != (undefined1  [8])auStack_458) {
            operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar12 = (undefined8 *)
                      ::std::__cxx11::string::_M_append(local_3f8,(ulong)(err->_M_dataplus)._M_p);
            plVar11 = puVar12 + 2;
            if ((long *)*puVar12 == plVar11) {
              auStack_458 = (undefined1  [8])*plVar11;
              bStack_450._M_dataplus._M_p = (pointer)puVar12[3];
              local_468 = (undefined1  [8])auStack_458;
            }
            else {
              auStack_458 = (undefined1  [8])*plVar11;
              local_468 = (undefined1  [8])*puVar12;
            }
            local_460._M_p = (pointer)puVar12[1];
            *puVar12 = plVar11;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_468);
            if (local_468 != (undefined1  [8])auStack_458) {
              operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_3f8 + 0x10)) {
              operator_delete((void *)local_3f8._0_8_,
                              CONCAT62(local_3f8._18_6_,local_3f8._16_2_) + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          ::std::ios_base::~ios_base(local_148);
          goto LAB_001fb85e;
        }
      }
      else {
LAB_001fb61d:
        if ((iVar9 != 3) && (iVar9 != 0)) {
LAB_001fb85e:
          bVar25 = false;
          goto LAB_001fb860;
        }
      }
      p_Var15 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
    } while (p_Var15 != local_278);
    bVar25 = true;
  }
LAB_001fb860:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_268,(_Link_type)local_260._M_parent);
  return bVar25;
}

Assistant:

bool ReconstructPrim<SkelAnimation>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SkelAnimation *skelanim,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)spec;
  (void)warn;
  (void)references;
  (void)options;
  std::set<std::string> table;
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "joints", SkelAnimation, skelanim->joints)
    PARSE_TYPED_ATTRIBUTE(table, prop, "translations", SkelAnimation, skelanim->translations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "rotations", SkelAnimation, skelanim->rotations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "scales", SkelAnimation, skelanim->scales)
    PARSE_TYPED_ATTRIBUTE(table, prop, "blendShapes", SkelAnimation, skelanim->blendShapes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "blendShapeWeights", SkelAnimation, skelanim->blendShapeWeights)
    ADD_PROPERTY(table, prop, Skeleton, skelanim->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}